

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O0

void __thiscall
QXmlStreamReaderPrivate::putString(QXmlStreamReaderPrivate *this,QStringView s,qsizetype from)

{
  long lVar1;
  QStringView s_00;
  bool bVar2;
  char16_t cVar3;
  QXmlStreamSimpleStack<unsigned_int> *this_00;
  pointer this_01;
  uint *puVar4;
  QXmlStreamReaderPrivate *in_RCX;
  storage_type_conflict *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  QStringView QVar5;
  const_reverse_iterator end;
  const_reverse_iterator it;
  reverse_iterator<const_QChar_*> *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  uint in_stack_ffffffffffffffa4;
  undefined1 in_stack_ffffffffffffffb8 [16];
  reverse_iterator<const_QChar_*> in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RCX == (QXmlStreamReaderPrivate *)0x0) {
    this_00 = (QXmlStreamSimpleStack<unsigned_int> *)(in_RDI + 200);
    QStringView::size((QStringView *)&stack0xffffffffffffffe8);
    QXmlStreamSimpleStack<unsigned_int>::reserve
              (this_00,CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    QStringView::rbegin((QStringView *)this_00);
    QStringView::rend((QStringView *)this_00);
    while (bVar2 = std::operator!=((reverse_iterator<const_QChar_*> *)
                                   CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                                   in_stack_ffffffffffffff98), bVar2) {
      this_01 = std::reverse_iterator<const_QChar_*>::operator->
                          ((reverse_iterator<const_QChar_*> *)
                           CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
      cVar3 = QChar::unicode(this_01);
      in_stack_ffffffffffffffa4 = (uint)(ushort)cVar3;
      puVar4 = QXmlStreamSimpleStack<unsigned_int>::rawPush
                         ((QXmlStreamSimpleStack<unsigned_int> *)(in_RDI + 200));
      *puVar4 = in_stack_ffffffffffffffa4;
      std::reverse_iterator<const_QChar_*>::operator++
                ((reverse_iterator<const_QChar_*> *)&stack0xffffffffffffffe0);
    }
  }
  else {
    QVar5 = QStringView::mid(in_stack_ffffffffffffffb8._0_8_,(qsizetype)in_RCX,
                             in_stack_ffffffffffffffb8._8_8_);
    s_00.m_data = in_RSI;
    s_00.m_size = (qsizetype)in_stack_ffffffffffffffe0.current;
    putString(in_RCX,s_00,(qsizetype)QVar5.m_data);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QXmlStreamReaderPrivate::putString(QStringView s, qsizetype from)
{
    if (from != 0) {
        putString(s.mid(from));
        return;
    }
    putStack.reserve(s.size());
    for (auto it = s.rbegin(), end = s.rend(); it != end; ++it)
        putStack.rawPush() = it->unicode();
}